

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O3

void Ivy_TruthDsdComputePrint(uint uTruth)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  
  if (Ivy_TruthDsdComputePrint::vTree == (Vec_Int_t *)0x0) {
    pVVar2 = (Vec_Int_t *)malloc(0x10);
    pVVar2->nCap = 0x10;
    pVVar2->nSize = 0;
    piVar3 = (int *)malloc(0x40);
    pVVar2->pArray = piVar3;
    Ivy_TruthDsdComputePrint::vTree = pVVar2;
  }
  iVar1 = Ivy_TruthDsd(uTruth,Ivy_TruthDsdComputePrint::vTree);
  if (iVar1 != 0) {
    Ivy_TruthDsdPrint(_stdout,Ivy_TruthDsdComputePrint::vTree);
    return;
  }
  puts("Undecomposable");
  return;
}

Assistant:

void Ivy_TruthDsdComputePrint( unsigned uTruth )
{
    static Vec_Int_t * vTree = NULL;
    if ( vTree == NULL )
        vTree = Vec_IntAlloc( 12 );
    if ( Ivy_TruthDsd( uTruth, vTree ) )
        Ivy_TruthDsdPrint( stdout, vTree );
    else
        printf( "Undecomposable\n" );
}